

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
Address_TaprootScriptAddressTest_Test::~Address_TaprootScriptAddressTest_Test
          (Address_TaprootScriptAddressTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, TaprootScriptAddressTest) {
  try {
    const SchnorrPubkey pubkey(
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
    ScriptBuilder build;
    build.AppendOperator(ScriptOperator::OP_TRUE);
    TaprootScriptTree tree(build.Build());
    Address address;
    address = Address(NetType::kMainnet,
                    WitnessVersion::kVersion1, tree, pubkey);
    EXPECT_STREQ("bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kMainnet, address.GetNetType());
    EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
    EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
    EXPECT_STREQ("88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
                address.GetHash().GetHex().c_str());
    EXPECT_EQ("tl(51)",
              address.GetScriptTree().ToString());
    EXPECT_STREQ("", address.GetScript().GetHex().c_str());
    EXPECT_STREQ("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
        address.GetLockingScript().GetHex().c_str());

    auto formats = cfd::core::GetBitcoinAddressFormatList();
    EXPECT_NO_THROW((address = Address(NetType::kTestnet,
                    WitnessVersion::kVersion1, tree, pubkey, formats[1])));
    EXPECT_STREQ("tb1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vs7rjr8c",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kTestnet, address.GetNetType());

    EXPECT_NO_THROW((address = Address(NetType::kRegtest,
                    WitnessVersion::kVersion1, tree, pubkey, formats)));
    EXPECT_STREQ("bcrt1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsn6c9jz",
                address.GetAddress().c_str());
    EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}